

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O1

QFunctionJAOHInterface *
ArgumentUtils::GetQheuristicFromArgs(PlanningUnitDecPOMDPDiscrete *pu,Arguments *args)

{
  pointer pcVar1;
  QMDP *this;
  AlphaVectorPlanning *pAVar2;
  QBGPlanner_TreeIncPruneBnB *this_00;
  QFunctionJAOHInterface *this_01;
  TreeIncPruneBGPlanner *this_02;
  ostream *poVar3;
  E *this_03;
  long lVar4;
  Arguments args1;
  undefined1 local_258 [488];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined8 uStack_50;
  char *pcStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  size_t sStack_30;
  undefined8 uStack_28;
  
  switch(args->qheur) {
  case eQMDP:
  case eQheurUndefined:
    this = (QMDP *)operator_new(0x70);
    QMDP::QMDP(this,pu,false);
    goto LAB_0038d4b0;
  case eQPOMDP:
    this_01 = (QFunctionJAOHInterface *)operator_new(0x60);
    QPOMDP::QPOMDP((QPOMDP *)this_01,pu);
    break;
  case eQBG:
    this_01 = (QFunctionJAOHInterface *)operator_new(0x60);
    QBG::QBG((QBG *)this_01,pu);
    break;
  case eQMDPc:
    this = (QMDP *)operator_new(0x70);
    QMDP::QMDP(this,pu,true);
LAB_0038d4b0:
    lVar4 = *(long *)(*(long *)this + -0x98);
    goto LAB_0038d532;
  case eQPOMDPav:
    pAVar2 = (AlphaVectorPlanning *)operator_new(400);
    MonahanPOMDPPlanner::MonahanPOMDPPlanner((MonahanPOMDPPlanner *)pAVar2,pu,true);
    AlphaVectorPlanning::SetAcceleratedPruningThreshold(pAVar2,args->acceleratedPruningThreshold);
    this = (QMDP *)operator_new(0x38);
    QAV<MonahanPOMDPPlanner>::QAV((QAV<MonahanPOMDPPlanner> *)this,pu,(MonahanPOMDPPlanner *)pAVar2)
    ;
    goto LAB_0038d527;
  case eQBGav:
    pAVar2 = (AlphaVectorPlanning *)operator_new(400);
    MonahanBGPlanner::MonahanBGPlanner((MonahanBGPlanner *)pAVar2,pu,true);
    AlphaVectorPlanning::SetAcceleratedPruningThreshold(pAVar2,args->acceleratedPruningThreshold);
    this = (QMDP *)operator_new(0x38);
    QAV<MonahanBGPlanner>::QAV((QAV<MonahanBGPlanner> *)this,pu,(MonahanBGPlanner *)pAVar2);
    goto LAB_0038d527;
  case eQHybrid:
    this_01 = GetHybridQheuristicFromArgs(pu,args);
    break;
  case eQPOMDPhybrid:
    memcpy(local_258,args,0x1e8);
    local_70._M_p = (pointer)&local_60;
    pcVar1 = (args->maxplus_updateT)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (args->maxplus_updateT)._M_string_length);
    uStack_50._0_4_ = args->BnBJointTypeOrdering;
    uStack_50._4_1_ = args->BnB_keepAll;
    uStack_50._5_1_ = args->BnB_consistentCompleteInformationHeur;
    uStack_50._6_2_ = *(undefined2 *)&args->field_0x20e;
    pcStack_48 = args->bgFilename;
    local_40._0_4_ = args->startIndex;
    local_40._4_4_ = args->endIndex;
    uStack_38._0_1_ = args->useASCIIformat;
    uStack_38._1_1_ = args->isCGBG;
    uStack_38._2_1_ = args->marginalize;
    uStack_38._3_5_ = *(undefined5 *)&args->field_0x223;
    sStack_30 = args->marginalizationIndex;
    uStack_28._0_4_ = args->falseNegativeObs;
    uStack_28._4_4_ = args->mmdp_method;
    local_258._328_4_ = eQPOMDP;
    local_258._332_4_ = eQPOMDP;
    this_01 = GetHybridQheuristicFromArgs(pu,(Arguments *)local_258);
    goto LAB_0038d670;
  case eQBGhybrid:
    memcpy(local_258,args,0x1e8);
    local_70._M_p = (pointer)&local_60;
    pcVar1 = (args->maxplus_updateT)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (args->maxplus_updateT)._M_string_length);
    uStack_50._0_4_ = args->BnBJointTypeOrdering;
    uStack_50._4_1_ = args->BnB_keepAll;
    uStack_50._5_1_ = args->BnB_consistentCompleteInformationHeur;
    uStack_50._6_2_ = *(undefined2 *)&args->field_0x20e;
    pcStack_48 = args->bgFilename;
    local_40._0_4_ = args->startIndex;
    local_40._4_4_ = args->endIndex;
    uStack_38._0_1_ = args->useASCIIformat;
    uStack_38._1_1_ = args->isCGBG;
    uStack_38._2_1_ = args->marginalize;
    uStack_38._3_5_ = *(undefined5 *)&args->field_0x223;
    sStack_30 = args->marginalizationIndex;
    uStack_28._0_4_ = args->falseNegativeObs;
    uStack_28._4_4_ = args->mmdp_method;
    local_258._328_4_ = eQBG;
    local_258._332_4_ = eQBG;
    this_01 = GetHybridQheuristicFromArgs(pu,(Arguments *)local_258);
LAB_0038d670:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    break;
  case eQBGTreeIncPrune:
    this_02 = (TreeIncPruneBGPlanner *)operator_new(0x290);
    TreeIncPruneBGPlanner::TreeIncPruneBGPlanner(this_02,pu);
    this_02->_m_pruneAfterUnion = args->TreeIPpruneAfterUnion;
    this_02->_m_pruneAfterCrossSum = args->TreeIPpruneAfterCrossSum;
    this_02->_m_useVectorCache = args->TreeIPuseVectorCache;
    this = (QMDP *)operator_new(0x38);
    QAV<TreeIncPruneBGPlanner>::QAV((QAV<TreeIncPruneBGPlanner> *)this,pu,this_02);
    goto LAB_0038d527;
  case eQBGTreeIncPruneBnB:
    this_00 = (QBGPlanner_TreeIncPruneBnB *)operator_new(0x248);
    QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB(this_00,pu);
    this = (QMDP *)operator_new(0x38);
    QAV<QBGPlanner_TreeIncPruneBnB>::QAV((QAV<QBGPlanner_TreeIncPruneBnB> *)this,pu,this_00);
LAB_0038d527:
    lVar4 = *(long *)(*(long *)this + -0x90);
LAB_0038d532:
    this_01 = (QFunctionJAOHInterface *)((long)&this->field_0x0 + lVar4);
    break;
  default:
    this_01 = (QFunctionJAOHInterface *)0x0;
  }
  if (this_01 == (QFunctionJAOHInterface *)0x0) {
    this_03 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_03,"argumentUtils::GetQheuristicFromArgs() no Q heuristic instantiated");
    __cxa_throw(this_03,&E::typeinfo,E::~E);
  }
  if (0 < args->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Instantiated ",0xd);
    (**(code **)(*(long *)((long)&this_01->field_0x0 + *(long *)((long)*this_01 + -0x60)) + 0x48))
              (local_258,(long)&this_01->field_0x0 + *(long *)((long)*this_01 + -0x60));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_258._0_8_,local_258._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," heuristic.",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
    }
  }
  return this_01;
}

Assistant:

QFunctionJAOHInterface* GetQheuristicFromArgs(
    const PlanningUnitDecPOMDPDiscrete* pu,
    const ArgumentHandlers::Arguments &args)
{
    QFunctionJAOHInterface* q=0;
#if 0
    QAVParameters qavParams;
    bool useAV=false;
#endif
    switch(args.qheur)
    {
    case eQMDP:
    case eQheurUndefined: // if undefined,we default to QMDP
        q = new QMDP(pu,false);
        break;
    case eQPOMDP:
        q = new QPOMDP(pu);
        break;
    case eQBG:
        q = new QBG(pu);
        break;
    case eQMDPc:
        q = new QMDP(pu,true);
        break;
    case eQPOMDPav:
    {
        //true means 'use incremental pruning'
        MonahanPOMDPPlanner *M=new MonahanPOMDPPlanner(pu,true);
        M->SetAcceleratedPruningThreshold(args.acceleratedPruningThreshold);
        q = new QAV<MonahanPOMDPPlanner>(pu,M);

        break;
    }
    case eQBGav:
    {
        //true means 'use incremental pruning'
        MonahanBGPlanner *M=new MonahanBGPlanner(pu,true);
        M->SetAcceleratedPruningThreshold(args.acceleratedPruningThreshold);
        q = new QAV<MonahanBGPlanner>(pu,M);

        break;
    }
    case eQHybrid:
        q = GetHybridQheuristicFromArgs(pu,args);
        break;
    case eQPOMDPhybrid:
    {
        ArgumentHandlers::Arguments args1=args;
        args1.QHybridFirstTS=eQPOMDP;
        args1.QHybridLastTS=eQPOMDP;
#if 0 // don't override this any more
        args1.QHybridHorizonLastTimeSteps=0;
#endif
        q = GetHybridQheuristicFromArgs(pu,args1);
        break;
    }
    case eQBGhybrid:
    {
        ArgumentHandlers::Arguments args1=args;
        args1.QHybridFirstTS=eQBG;
        args1.QHybridLastTS=eQBG;
#if 0 // don't override this any more
        args1.QHybridHorizonLastTimeSteps=0;
#endif
        q=GetHybridQheuristicFromArgs(pu,args1);
        break;
    }
    case eQBGTreeIncPrune:
    {
        TreeIncPruneBGPlanner *M=new TreeIncPruneBGPlanner(pu);
        if(args.TreeIPpruneAfterUnion)
            M->SetPruneAfterUnion(true);
        else
            M->SetPruneAfterUnion(false);
        if(args.TreeIPpruneAfterCrossSum)
            M->SetPruneAfterCrossSum(true);
        else
            M->SetPruneAfterCrossSum(false);
        if(args.TreeIPuseVectorCache)
            M->SetUseVectorCache(true);
        else
            M->SetUseVectorCache(false);
            
        q = new QAV<TreeIncPruneBGPlanner>(pu,M);

        break;
    }
    case eQBGTreeIncPruneBnB:
    {
        QBGPlanner_TreeIncPruneBnB *M=new QBGPlanner_TreeIncPruneBnB(pu);
        q = new QAV<QBGPlanner_TreeIncPruneBnB>(pu,M);
        break;
    }
    }
    if(q==0)
        throw(E("argumentUtils::GetQheuristicFromArgs() no Q heuristic instantiated"));

    if(args.verbose>0)
        cout << "Instantiated " << q->SoftPrintBrief() << " heuristic." << endl;
    
    return(q);
}